

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

int move_messages_between_lists(SINGLYLINKEDLIST_HANDLE from_list,SINGLYLINKEDLIST_HANDLE to_list)

{
  int iVar1;
  LIST_ITEM_HANDLE pLVar2;
  MESSAGE_QUEUE_ITEM *mq_item_00;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MESSAGE_QUEUE_ITEM *mq_item;
  LIST_ITEM_HANDLE list_item;
  int result;
  SINGLYLINKEDLIST_HANDLE to_list_local;
  SINGLYLINKEDLIST_HANDLE from_list_local;
  
  do {
    pLVar2 = singlylinkedlist_get_head_item(from_list);
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      return 0;
    }
    mq_item_00 = (MESSAGE_QUEUE_ITEM *)singlylinkedlist_item_get_value(pLVar2);
    iVar1 = singlylinkedlist_remove(from_list,pLVar2);
    if (iVar1 != 0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"move_messages_between_lists",0x176,1,"failed removing message from list");
      }
      return 0x177;
    }
    if (mq_item_00 == (MESSAGE_QUEUE_ITEM *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"move_messages_between_lists",0x17c,1,"failed moving message to list");
      }
      return 0x17d;
    }
    pLVar2 = singlylinkedlist_add(to_list,mq_item_00);
  } while (pLVar2 != (LIST_ITEM_HANDLE)0x0);
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 != (LOGGER_LOG)0x0) {
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
              ,"move_messages_between_lists",0x182,1,"failed moving message to list");
  }
  fire_message_callback(mq_item_00,MESSAGE_QUEUE_CANCELLED,(void *)0x0);
  free(mq_item_00);
  return 0x185;
}

Assistant:

static int move_messages_between_lists(SINGLYLINKEDLIST_HANDLE from_list, SINGLYLINKEDLIST_HANDLE to_list)
{
    int result;
    LIST_ITEM_HANDLE list_item;

    result = RESULT_OK;

    while ((list_item = singlylinkedlist_get_head_item(from_list)) != NULL)
    {
        MESSAGE_QUEUE_ITEM* mq_item = (MESSAGE_QUEUE_ITEM*)singlylinkedlist_item_get_value(list_item);

        if (singlylinkedlist_remove(from_list, list_item) != 0)
        {
            LogError("failed removing message from list");
            result = MU_FAILURE;
            break;
        }
        else if (mq_item == NULL)
        {
            LogError("failed moving message to list");
            result = MU_FAILURE;
            break;
        }
        else if (singlylinkedlist_add(to_list, (const void*)mq_item) == NULL)
        {
            LogError("failed moving message to list");
            fire_message_callback(mq_item, MESSAGE_QUEUE_CANCELLED, NULL);
            free(mq_item);
            result = MU_FAILURE;
            break;
        }
    }

    return result;
}